

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# problem_11.cpp
# Opt level: O1

vector<int,_std::allocator<int>_> *
calculateFibonacci(vector<int,_std::allocator<int>_> *__return_storage_ptr__,int32_t n)

{
  int iVar1;
  undefined8 in_RAX;
  int iVar2;
  iterator __position;
  int32_t next;
  undefined8 uStack_28;
  
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  __position._M_current =
       (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  if ((long)__position._M_current >> 2 != (long)n) {
    iVar1 = 1;
    iVar2 = 1;
    uStack_28 = in_RAX;
    do {
      uStack_28 = CONCAT44(iVar1 + iVar2,(undefined4)uStack_28);
      if (__position._M_current ==
          (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__position,
                   (int *)((long)&uStack_28 + 4));
      }
      else {
        *__position._M_current = iVar1 + iVar2;
        (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      __position._M_current =
           (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_finish;
      iVar1 = iVar2;
      iVar2 = uStack_28._4_4_;
    } while ((long)__position._M_current -
             (long)(__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start >> 2 != (long)n);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<int32_t> calculateFibonacci(int32_t n)
{
	std::vector<int32_t> fibonacciSeries;
	int32_t prev = 1;
	int32_t current = 1;
	while (fibonacciSeries.size() != n)
	{
		int32_t next = prev + current;
		fibonacciSeries.push_back(next);
		prev = current;
		current = next;
	}
	return fibonacciSeries;
}